

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

void get_ui_entry_label(ui_entry *entry,wchar_t length,_Bool pad_left,wchar_t *label)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t *__src;
  undefined1 auVar3 [16];
  wchar_t wVar4;
  uint uVar5;
  size_t sVar6;
  wchar_t **ppwVar7;
  long lVar8;
  ulong uVar9;
  wchar_t *pwVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  
  if (get_ui_entry_label_first_call == '\0') {
    sVar6 = text_mbstowcs(get_ui_entry_label::spc," ",L'\x02');
    if (sVar6 == 0xffffffffffffffff) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                    ,0x132,"void get_ui_entry_label(const struct ui_entry *, int, _Bool, wchar_t *)"
                   );
    }
    get_ui_entry_label_first_call = '\x01';
  }
  wVar4 = get_ui_entry_label::spc[0];
  auVar3 = _DAT_00224950;
  if (length < L'\x01') {
    return;
  }
  if (length == L'\x01') {
    *label = get_ui_entry_label::spc[1];
    return;
  }
  pwVar10 = entry->nshortened + (uint)(length + L'\xfffffffe');
  if (0xb < (uint)length) {
    pwVar10 = &entry->nlabel;
  }
  ppwVar7 = entry->shortened_labels + (uint)(length + L'\xfffffffe');
  if (0xb < (uint)length) {
    ppwVar7 = &entry->label;
  }
  __src = *ppwVar7;
  wVar2 = *pwVar10;
  uVar12 = (ulong)wVar2;
  wVar1 = length + L'\xffffffff';
  uVar11 = (ulong)(uint)wVar1;
  pwVar10 = label;
  uVar9 = uVar11;
  if (wVar2 < wVar1) {
    if (!pad_left) {
      memcpy(label,__src,uVar12 * 4);
      wVar4 = get_ui_entry_label::spc[0];
      auVar16 = _DAT_002256f0;
      auVar15 = _DAT_00224950;
      auVar3 = _DAT_00224940;
      lVar8 = (uVar11 - uVar12) + -1;
      auVar18._8_4_ = (int)lVar8;
      auVar18._0_8_ = lVar8;
      auVar18._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar9 = 0;
      auVar18 = auVar18 ^ _DAT_00224950;
      do {
        auVar17._8_4_ = (int)uVar9;
        auVar17._0_8_ = uVar9;
        auVar17._12_4_ = (int)(uVar9 >> 0x20);
        auVar13 = (auVar17 | auVar3) ^ auVar15;
        iVar14 = auVar18._4_4_;
        if ((bool)(~(auVar13._4_4_ == iVar14 && auVar18._0_4_ < auVar13._0_4_ ||
                    iVar14 < auVar13._4_4_) & 1)) {
          label[uVar12 + uVar9] = wVar4;
        }
        if ((auVar13._12_4_ != auVar18._12_4_ || auVar13._8_4_ <= auVar18._8_4_) &&
            auVar13._12_4_ <= auVar18._12_4_) {
          label[uVar12 + uVar9 + 1] = wVar4;
        }
        auVar13 = (auVar17 | auVar16) ^ auVar15;
        iVar19 = auVar13._4_4_;
        if (iVar19 <= iVar14 && (iVar19 != iVar14 || auVar13._0_4_ <= auVar18._0_4_)) {
          label[uVar12 + uVar9 + 2] = wVar4;
          label[uVar12 + uVar9 + 3] = wVar4;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar11 - uVar12) + 3 & 0xfffffffffffffffc) != uVar9);
      goto LAB_001e1623;
    }
    uVar5 = wVar1 - wVar2;
    if (uVar5 != 0 && wVar2 <= wVar1) {
      lVar8 = (ulong)uVar5 - 1;
      auVar13._8_4_ = (int)lVar8;
      auVar13._0_8_ = lVar8;
      auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar9 = 0;
      auVar13 = auVar13 ^ _DAT_00224950;
      auVar15 = _DAT_002256f0;
      auVar16 = _DAT_00224940;
      do {
        auVar18 = auVar16 ^ auVar3;
        iVar14 = auVar13._4_4_;
        if ((bool)(~(auVar18._4_4_ == iVar14 && auVar13._0_4_ < auVar18._0_4_ ||
                    iVar14 < auVar18._4_4_) & 1)) {
          label[uVar9] = wVar4;
        }
        if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
            auVar18._12_4_ <= auVar13._12_4_) {
          label[uVar9 + 1] = wVar4;
        }
        auVar18 = auVar15 ^ auVar3;
        iVar19 = auVar18._4_4_;
        if (iVar19 <= iVar14 && (iVar19 != iVar14 || auVar18._0_4_ <= auVar13._0_4_)) {
          label[uVar9 + 2] = wVar4;
          label[uVar9 + 3] = wVar4;
        }
        uVar9 = uVar9 + 4;
        lVar8 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 4;
        auVar16._8_8_ = lVar8 + 4;
        lVar8 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 4;
        auVar15._8_8_ = lVar8 + 4;
      } while ((uVar5 + 3 & 0xfffffffc) != uVar9);
    }
    pwVar10 = label + (ulong)(uint)length + (-1 - uVar12);
    uVar9 = uVar12;
  }
  memcpy(pwVar10,__src,uVar9 * 4);
LAB_001e1623:
  label[uVar11] = get_ui_entry_label::spc[1];
  return;
}

Assistant:

void get_ui_entry_label(const struct ui_entry *entry, int length,
	bool pad_left, wchar_t *label)
{
	static bool first_call = true;
	static wchar_t spc[2];
	const wchar_t *src;
	int n;

	if (first_call) {
		size_t nw = text_mbstowcs(spc, " ", 2);

		if (nw == (size_t)-1) assert(0);
		first_call = false;
	}

	if (length <= 0) {
		return;
	}
	if (length == 1) {
		label[0] = spc[1];
		return;
	}
	if (length <= MAX_SHORTENED + 1) {
		src = entry->shortened_labels[length - 2];
		n = entry->nshortened[length - 2];
	} else {
		src = entry->label;
		n = entry->nlabel;
	}
	if (n < length - 1) {
		int i;

		if (pad_left) {
			for (i = 0; i < length - 1 - n; ++i) {
				label[i] = spc[0];
			}
			(void) memcpy(label + length - 1 - n, src,
				n * sizeof(*label));
		} else {
			(void) memcpy(label, src, n * sizeof(*label));
			for (i = n; i < length - 1; ++i) {
				label[i] = spc[0];
			}
		}
	} else {
		(void) memcpy(label, src, (length - 1) * sizeof(*label));
	}
	label[length - 1] = spc[1];
}